

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O1

void eve::emitevents(OASIS_INT pno_,OASIS_INT total_,vector<int,_std::allocator<int>_> *events,
                    bool textmode)

{
  int iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int eventid;
  undefined8 uStack_38;
  
  uVar2 = (ulong)((long)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar2 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
  iVar4 = (int)((long)uVar2 % (long)total_);
  iVar6 = iVar4 + 1;
  iVar3 = pno_;
  if (iVar6 < pno_) {
    iVar3 = iVar6;
  }
  iVar1 = (int)((long)uVar2 / (long)total_);
  iVar5 = (iVar3 + -1) * (iVar1 + 1);
  iVar3 = -(iVar6 - pno_);
  if (-1 < iVar6 - pno_) {
    iVar3 = 0;
  }
  if (pno_ + 1 < iVar6) {
    iVar6 = pno_ + 1;
  }
  iVar4 = pno_ - iVar4;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  iVar4 = iVar4 * iVar1 + (iVar6 + -1) * (iVar1 + 1);
  if (iVar5 + iVar3 * iVar1 < iVar4) {
    lVar7 = (long)iVar5 + (long)(iVar3 * iVar1);
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44((events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar7],(undefined4)uStack_38);
      if (textmode) {
        fprintf(_stdout,"%d\n");
      }
      else {
        fwrite((void *)((long)&uStack_38 + 4),4,1,_stdout);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return;
}

Assistant:

void emitevents(OASIS_INT pno_, OASIS_INT total_, std::vector<int> &events,
                    bool textmode) {

	int total_events = (int)events.size();
	int min_chunksize = total_events / total_;
	int first_min_pno = (total_events % total_) + 1;
	int start_pos = (min_chunksize + 1) * (std::min(first_min_pno, pno_) - 1);
	start_pos += min_chunksize * std::max(pno_ - first_min_pno, 0);
	int end_pos = (min_chunksize + 1) * (std::min(first_min_pno, pno_+1) - 1);
	end_pos += min_chunksize * std::max(pno_+1 - first_min_pno, 0);

        while (start_pos < end_pos) {
            int eventid = events[start_pos];
            if (textmode == true)
                fprintf(stdout, "%d\n", eventid);
            else
                fwrite(&eventid, sizeof(eventid), 1, stdout);
            start_pos++;
        }
    }